

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::PeriodicDelaunay3dThread::insert(PeriodicDelaunay3dThread *this,index_t v,index_t *hint)

{
  pointer piVar1;
  vector<unsigned_int> *pvVar2;
  pointer puVar3;
  vector<int> *pvVar4;
  bool bVar5;
  index_t t;
  index_t iVar6;
  undefined4 in_ECX;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  index_t v_local;
  index_t f_bndry;
  index_t t_bndry;
  Sign orient [4];
  vec3 p;
  vec4 p_lifted;
  
  auVar12._0_4_ = -(uint)(v == this->v1_);
  auVar12._4_4_ = -(uint)(v == this->v2_);
  auVar12._8_4_ = -(uint)(v == this->v3_);
  auVar12._12_4_ = -(uint)(v == this->v4_);
  iVar7 = movmskps(in_ECX,auVar12);
  if (iVar7 != 0) {
    return true;
  }
  v_local = v;
  vertex(&p,this,v);
  iVar6 = *hint;
  t = locate(this,&v_local,&p,iVar6,orient);
  if (t == 0xffffffff) {
    this->nb_failed_locate_ = this->nb_failed_locate_ + 1;
  }
  else {
    auVar11._0_4_ = -(uint)(orient[0] == ZERO);
    auVar11._4_4_ = -(uint)(orient[1] == ZERO);
    auVar11._8_4_ = -(uint)(orient[2] == ZERO);
    auVar11._12_4_ = -(uint)(orient[3] == ZERO);
    iVar7 = movmskps(iVar6,auVar11);
    if (2 < ((byte)(0x4332322132212110 >> ((byte)(iVar7 << 2) & 0x3f)) & 7)) {
      (this->cell_thread_->
      super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>).
      super__Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>._M_impl.
      super__Vector_impl_data._M_start[t] = 0xff;
      return true;
    }
    t_bndry = 0xffffffff;
    f_bndry = 0xffffffff;
    lifted_vertex(&p_lifted,this,v_local,&p);
    (this->cavity_).nb_f_ = 0;
    (this->cavity_).OK_ = true;
    memset(&this->cavity_,0xff,0x400);
    bVar5 = find_conflict_zone(this,v_local,&p_lifted,t,&t_bndry,&f_bndry);
    if ((this->nb_free_ < this->nb_tets_to_create_) &&
       (0 < ::(anonymous_namespace)::running_threads_invocations_)) {
      this->memory_overflow_ = true;
    }
    else if (bVar5) {
      if ((int)((ulong)((long)(this->tets_to_delete_).
                              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                              .
                              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->tets_to_delete_).
                             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             .
                             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) != 0) {
        if ((this->cavity_).OK_ == true) {
          iVar6 = stellate_cavity(this,v_local);
        }
        else {
          iVar6 = stellate_conflict_zone_iterative(this,v_local,t_bndry,f_bndry,0xffffffff);
        }
        pvVar2 = this->cell_next_;
        puVar3 = (this->tets_to_delete_).
                 super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                 super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (ulong)((long)(this->tets_to_delete_).
                              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                              .
                              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2;
        iVar7 = (int)uVar8;
        uVar9 = (ulong)(iVar7 - 1);
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          (pvVar2->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
          super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
          _M_impl.super__Vector_impl_data._M_start[puVar3[uVar10]] = puVar3[uVar10 + 1];
        }
        (pvVar2->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[puVar3[uVar9]] = this->first_free_;
        this->first_free_ = *puVar3;
        this->nb_free_ = this->nb_free_ + iVar7;
        pvVar4 = this->cell_to_v_store_;
        for (uVar9 = 0; (uVar8 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
          piVar1 = (pvVar4->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start + (puVar3[uVar9] << 2);
          piVar1[0] = -2;
          piVar1[1] = -2;
          piVar1[2] = -2;
          piVar1[3] = -2;
        }
        *hint = iVar6;
        release_tets(this);
        return true;
      }
      release_tets(this);
      this->has_empty_cells_ = true;
      return true;
    }
    release_tets(this);
  }
  return false;
}

Assistant:

bool insert(index_t v, index_t& hint) {

            // If v is one of the vertices of the
            // first tetrahedron, nothing to do.
            if(
                v == v1_ ||
                v == v2_ ||
                v == v3_ ||
                v == v4_
            ) {
                return true;
            }

	    vec3 p = vertex(v);
	    
            Sign orient[4];
            index_t t = locate(v,p,hint,orient);

            //   locate() may fail due to tets already owned by
            // other threads.
            if(t == NO_TETRAHEDRON) {
                ++nb_failed_locate_;
                geo_debug_assert(nb_acquired_tets_ == 0);
                return false;
            }

            //  At this point, t is a valid tetrahedron,
            // and this thread acquired a lock on it.

            // Test whether the point already exists in
            // the triangulation. The point already exists
            // if it's located on three faces of the
            // tetrahedron returned by locate().
            int nb_zero = 
                (orient[0] == ZERO) +
                (orient[1] == ZERO) +
                (orient[2] == ZERO) +
                (orient[3] == ZERO) ;

            if(nb_zero >= 3) {
                release_tet(t);
                return true;
            }

            geo_debug_assert(nb_acquired_tets_ == 1);

            index_t t_bndry = NO_TETRAHEDRON;
            index_t f_bndry = index_t(-1);

	    vec4 p_lifted = lifted_vertex(v,p);

	    cavity_.clear();
	    
            bool ok = find_conflict_zone(v,p_lifted,t,t_bndry,f_bndry);

            // When in multithreading mode, we cannot allocate memory
            // dynamically and we use a fixed pool. If the fixed pool
            // is full, then we exit the thread (and the missing points
            // are inserted after, in sequential mode).
            if(
                nb_tets_to_create_ > nb_free_ &&
                Process::is_running_threads()
            ) {
                memory_overflow_ = true;
                ok = false;
            }

            if(!ok) {
                //  At this point, this thread did not successfully
                // acquire all the tets in the conflict zone, so
                // we need to rollback.
                release_tets();
                geo_debug_assert(nb_acquired_tets_ == 0);
                return false;
            }

            // The conflict list can be empty if
            //  the triangulation is weighted and v is not visible
            if(tets_to_delete_.size() == 0) {
                release_tets();
                geo_debug_assert(nb_acquired_tets_ == 0);
		has_empty_cells_ = true;
                return true;
            }


            geo_debug_assert(
                nb_acquired_tets_ == 
                tets_to_delete_.size() + tets_to_release_.size()
            );

#ifdef GEO_DEBUG
            // Sanity check: make sure this threads owns all the tets 
            // in conflict and their neighbors.
            for(index_t i=0; i<tets_to_delete_.size(); ++i) {
                index_t tdel = tets_to_delete_[i];
                geo_debug_assert(owns_tet(tdel));
                for(index_t lf=0; lf<4; ++lf) {
                    geo_debug_assert(tet_adjacent(tdel,lf) >= 0);
                    geo_debug_assert(owns_tet(index_t(tet_adjacent(tdel,lf))));
                }
            }
#endif
            geo_debug_assert(owns_tet(t_bndry));
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t_bndry,f_bndry))));
            geo_debug_assert(
                !tet_is_marked_as_conflict(
                    index_t(tet_adjacent(t_bndry,f_bndry))
                )
            );

            //   At this point, this threads owns all the tets in conflict and
            // their neighbors, therefore no other thread can interfere, and
            // we can update the triangulation.

            index_t new_tet = index_t(-1);
	    if(cavity_.OK()) {
		new_tet = stellate_cavity(v);	
	    } else {
		new_tet = stellate_conflict_zone_iterative(v,t_bndry,f_bndry);
	    }
       
            // Recycle the tetrahedra of the conflict zone.
            for(index_t i=0; i<tets_to_delete_.size()-1; ++i) {
                cell_next_[tets_to_delete_[i]] = tets_to_delete_[i+1];
            }
            cell_next_[tets_to_delete_[tets_to_delete_.size()-1]] =
                first_free_;
            first_free_ = tets_to_delete_[0];
            nb_free_ += nb_tets_in_conflict();

	    // Reset deleted tet.
	    // This is needed because we update_v_to_cell() in
	    // a transient state.
	    // Note: update_v_to_cell() is overloaded here,
	    // with a check on nb_vertices_non_periodic_,
	    // this is why the (-2) does not make everything crash.
            for(index_t i=0; i<tets_to_delete_.size(); ++i) {
                index_t tdel = tets_to_delete_[i];
                set_tet_vertex(tdel,0,-2);
                set_tet_vertex(tdel,1,-2);
                set_tet_vertex(tdel,2,-2);
                set_tet_vertex(tdel,3,-2);
            }
       
            // Return one of the newly created tets
            hint=new_tet;
            release_tets();
            geo_debug_assert(nb_acquired_tets_ == 0);
            return true;
        }